

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::ipv6_peer::ipv6_peer(ipv6_peer *this,endpoint *ep,bool c,peer_source_flags_t src)

{
  undefined1 *puVar1;
  ushort uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  bad_address_cast ex;
  bad_address_cast local_10;
  
  uVar2 = (ep->impl_).data_.v4.sin_port;
  (this->super_torrent_peer).prev_amount_upload = 0;
  (this->super_torrent_peer).prev_amount_download = 0;
  (this->super_torrent_peer).connection = (peer_connection_interface *)0x0;
  (this->super_torrent_peer).peer_rank = 0;
  (this->super_torrent_peer).last_optimistically_unchoked = 0;
  (this->super_torrent_peer).last_connected = 0;
  (this->super_torrent_peer).port = uVar2 << 8 | uVar2 >> 8;
  (this->super_torrent_peer).hashfails = '\0';
  uVar5 = (int)CONCAT71(in_register_00000011,c) * 0x20;
  uVar4 = (src.m_val & 0x3f) * 0x20000;
  *(uint *)&(this->super_torrent_peer).field_0x1b = uVar4 + uVar5 + 0x10000000;
  puVar1 = &(this->super_torrent_peer).field_0x1f;
  *puVar1 = *puVar1 & 0xfe;
  if ((ep->impl_).data_.base.sa_family != 2) {
    uVar3 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x10);
    *(undefined8 *)(this->addr)._M_elems = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
    *(undefined8 *)((this->addr)._M_elems + 8) = uVar3;
    *(uint *)&(this->super_torrent_peer).field_0x1b = uVar4 | uVar5 | 0x11000000;
    return;
  }
  local_10 = (bad_address_cast)&PTR__bad_cast_004ee530;
  boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_10);
}

Assistant:

ipv6_peer::ipv6_peer(tcp::endpoint const& ep, bool c
		, peer_source_flags_t const src)
		: torrent_peer(ep.port(), c, src)
		, addr(ep.address().to_v6().to_bytes())
	{
		is_v6_addr = true;
#if TORRENT_USE_I2P
		is_i2p_addr = false;
#endif
#if TORRENT_USE_RTC
		is_rtc_addr = false;
#endif
	}